

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O2

int nghttp2_frame_pack_ping(nghttp2_bufs *bufs,nghttp2_ping *frame)

{
  nghttp2_buf_chain *pnVar1;
  uint8_t *puVar2;
  
  pnVar1 = bufs->head;
  if (pnVar1 != bufs->cur) {
    __assert_fail("bufs->head == bufs->cur",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                  ,0x25f,"int nghttp2_frame_pack_ping(nghttp2_bufs *, nghttp2_ping *)");
  }
  if (7 < (ulong)((long)(pnVar1->buf).end - (long)(pnVar1->buf).last)) {
    puVar2 = (pnVar1->buf).pos + -9;
    (pnVar1->buf).pos = puVar2;
    nghttp2_frame_pack_frame_hd(puVar2,&frame->hd);
    puVar2 = nghttp2_cpymem((pnVar1->buf).last,frame->opaque_data,8);
    (pnVar1->buf).last = puVar2;
    return 0;
  }
  __assert_fail("nghttp2_buf_avail(buf) >= 8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                ,0x263,"int nghttp2_frame_pack_ping(nghttp2_bufs *, nghttp2_ping *)");
}

Assistant:

int nghttp2_frame_pack_ping(nghttp2_bufs *bufs, nghttp2_ping *frame) {
  nghttp2_buf *buf;

  assert(bufs->head == bufs->cur);

  buf = &bufs->head->buf;

  assert(nghttp2_buf_avail(buf) >= 8);

  buf->pos -= NGHTTP2_FRAME_HDLEN;

  nghttp2_frame_pack_frame_hd(buf->pos, &frame->hd);

  buf->last =
      nghttp2_cpymem(buf->last, frame->opaque_data, sizeof(frame->opaque_data));

  return 0;
}